

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Convert_Glyph(black_PWorker worker,Int flipped)

{
  PProfile_conflict pTVar1;
  Bool BVar2;
  UShort first;
  bool local_31;
  Bool o;
  PProfile_conflict lastProfile;
  int local_20;
  UInt start;
  Int i;
  Int flipped_local;
  black_PWorker worker_local;
  
  worker->fProfile = (PProfile_conflict)0x0;
  worker->joint = '\0';
  worker->fresh = '\0';
  worker->maxBuff = worker->sizeBuff + -8;
  worker->numTurns = 0;
  worker->cProfile = (PProfile_conflict)worker->top;
  worker->cProfile->offset = worker->top;
  worker->num_Profs = 0;
  first = 0;
  local_20 = 0;
  while( true ) {
    if ((worker->outline).n_contours <= local_20) {
      BVar2 = Finalize_Profile_Table(worker);
      if (BVar2 == '\0') {
        worker_local._7_1_ = worker->maxBuff <= worker->top;
      }
      else {
        worker_local._7_1_ = true;
      }
      return worker_local._7_1_;
    }
    worker->state = Unknown_State;
    worker->gProfile = (PProfile_conflict)0x0;
    BVar2 = Decompose_Curve(worker,first,(worker->outline).contours[local_20],flipped);
    if (BVar2 != '\0') break;
    first = (worker->outline).contours[local_20] + 1;
    if (((((worker->lastY & (long)(worker->precision + -1)) == 0) && (worker->minY <= worker->lastY)
         ) && (worker->lastY <= worker->maxY)) &&
       ((worker->gProfile != (PProfile_conflict)0x0 &&
        ((worker->gProfile->flags & 8) == (worker->cProfile->flags & 8))))) {
      worker->top = worker->top + -1;
    }
    pTVar1 = worker->cProfile;
    if ((worker->top == worker->cProfile->offset) || ((worker->cProfile->flags & 8) == 0)) {
      local_31 = (long)worker->precision_half <=
                 (long)(((worker->lastY + (long)worker->precision) - 1U & (long)-worker->precision)
                       - worker->lastY);
    }
    else {
      local_31 = (long)worker->precision_half <=
                 worker->lastY - (worker->lastY & (long)-worker->precision);
    }
    BVar2 = End_Profile(worker,local_31);
    if (BVar2 != '\0') {
      return '\x01';
    }
    if (worker->gProfile != (PProfile_conflict)0x0) {
      pTVar1->next = worker->gProfile;
    }
    local_20 = local_20 + 1;
  }
  return '\x01';
}

Assistant:

static Bool
  Convert_Glyph( RAS_ARGS Int  flipped )
  {
    Int   i;
    UInt  start;


    ras.fProfile = NULL;
    ras.joint    = FALSE;
    ras.fresh    = FALSE;

    ras.maxBuff  = ras.sizeBuff - AlignProfileSize;

    ras.numTurns = 0;

    ras.cProfile         = (PProfile)ras.top;
    ras.cProfile->offset = ras.top;
    ras.num_Profs        = 0;

    start = 0;

    for ( i = 0; i < ras.outline.n_contours; i++ )
    {
      PProfile  lastProfile;
      Bool      o;


      ras.state    = Unknown_State;
      ras.gProfile = NULL;

      if ( Decompose_Curve( RAS_VARS (UShort)start,
                                     (UShort)ras.outline.contours[i],
                                     flipped ) )
        return FAILURE;

      start = (UShort)ras.outline.contours[i] + 1;

      /* we must now check whether the extreme arcs join or not */
      if ( FRAC( ras.lastY ) == 0 &&
           ras.lastY >= ras.minY  &&
           ras.lastY <= ras.maxY  )
        if ( ras.gProfile                        &&
             ( ras.gProfile->flags & Flow_Up ) ==
               ( ras.cProfile->flags & Flow_Up ) )
          ras.top--;
        /* Note that ras.gProfile can be nil if the contour was too small */
        /* to be drawn.                                                   */

      lastProfile = ras.cProfile;
      if ( ras.top != ras.cProfile->offset &&
           ( ras.cProfile->flags & Flow_Up ) )
        o = IS_TOP_OVERSHOOT( ras.lastY );
      else
        o = IS_BOTTOM_OVERSHOOT( ras.lastY );
      if ( End_Profile( RAS_VARS o ) )
        return FAILURE;

      /* close the `next profile in contour' linked list */
      if ( ras.gProfile )
        lastProfile->next = ras.gProfile;
    }

    if ( Finalize_Profile_Table( RAS_VAR ) )
      return FAILURE;

    return (Bool)( ras.top < ras.maxBuff ? SUCCESS : FAILURE );
  }